

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O3

bool uuids::uuid::is_valid_uuid<char[3]>(char (*in_str) [3])

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  sVar2 = strlen(*in_str);
  if ((sVar2 == 0) ||
     (((bVar7 = (*in_str)[0] == '{', bVar7 && (in_str[-1][sVar2 + 2] != '}')) ||
      (uVar3 = (ulong)bVar7, sVar2 - uVar3 <= uVar3)))) {
LAB_00171a50:
    bVar7 = false;
  }
  else {
    bVar4 = 1;
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar1 = (*in_str)[lVar5 + uVar3];
      if (bVar1 != 0x2d) {
        if (0xf < uVar6) goto LAB_00171a50;
        if (9 < (byte)(bVar1 - 0x30)) {
          if (0x25 < bVar1 - 0x41) {
            return false;
          }
          if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
            return false;
          }
        }
        bVar4 = ~bVar4 & 1;
        uVar6 = uVar6 + bVar4;
      }
      lVar5 = lVar5 + 1;
    } while (sVar2 - (uint)bVar7 * 2 != lVar5);
    bVar7 = 0xf < uVar6;
  }
  return bVar7;
}

Assistant:

[[nodiscard]] constexpr static bool is_valid_uuid(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         if (str.empty())
            return false;

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return false;

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return false;
            }

            if (firstDigit)
            {
               firstDigit = false;
            }
            else
            {
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return false;
         }

         return true;
      }